

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

cmStateSnapshot * __thiscall
cmState::CreateMacroCallSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot,
          string *fileName)

{
  PositionType *this_00;
  pointer pcVar1;
  cmLinkedTree<cmDefinitions> *pcVar2;
  iterator it;
  PositionType PVar3;
  ReferenceType __src;
  PointerType pSVar4;
  PointerType pBVar5;
  PointerType pSVar6;
  iterator iVar7;
  PositionType pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  iterator local_1e0;
  undefined1 local_1d0 [208];
  SnapshotDataType local_100;
  
  this_00 = &originSnapshot->Position;
  it.Tree = (originSnapshot->Position).Tree;
  it.Position = (originSnapshot->Position).Position;
  __src = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*(this_00);
  memcpy(local_1d0,__src,0xd0);
  memcpy(&local_100,local_1d0,0xd0);
  local_1e0 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl
                        (&this->SnapshotData,it,&local_100);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_1e0);
  pSVar4->SnapshotType = MacroCallType;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_1e0);
  pSVar4->Keep = false;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  iVar7 = pSVar4->ExecutionListFile;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar1,pcVar1 + fileName->_M_string_length);
  iVar7 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push_impl(&this->ExecutionListFiles,iVar7,&local_200);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_1e0);
  pSVar4->ExecutionListFile = iVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar2 = (pSVar4->Vars).Tree;
  if ((pcVar2 != (cmLinkedTree<cmDefinitions> *)0x0) &&
     ((pSVar4->Vars).Position <=
      (ulong)(((long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
    pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_1e0);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar4->BuildSystemDirectory);
    (pBVar5->DirectoryEnd).Tree = local_1e0.Tree;
    (pBVar5->DirectoryEnd).Position = local_1e0.Position;
    pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_1e0);
    PVar3 = (pSVar4->Policies).Position;
    (pSVar6->PolicyScope).Tree = (pSVar4->Policies).Tree;
    (pSVar6->PolicyScope).Position = PVar3;
    cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,local_1e0);
    return __return_storage_ptr__;
  }
  __assert_fail("originSnapshot.Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                ,799,
                "cmStateSnapshot cmState::CreateMacroCallSnapshot(const cmStateSnapshot &, const std::string &)"
               );
}

Assistant:

cmStateSnapshot cmState::CreateMacroCallSnapshot(
  cmStateSnapshot const& originSnapshot, std::string const& fileName)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->SnapshotType = cmStateEnums::MacroCallType;
  pos->Keep = false;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
    originSnapshot.Position->ExecutionListFile, fileName);
  assert(originSnapshot.Position->Vars.IsValid());
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmStateSnapshot(this, pos);
}